

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AllContentModel::~AllContentModel(AllContentModel *this)

{
  ulong local_18;
  XMLSize_t index;
  AllContentModel *this_local;
  
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__AllContentModel_00533848
  ;
  for (local_18 = 0; local_18 < this->fCount; local_18 = local_18 + 1) {
    if (this->fChildren[local_18] != (QName *)0x0) {
      (*(this->fChildren[local_18]->super_XSerializable)._vptr_XSerializable[1])();
    }
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildren);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildOptional);
  XMLContentModel::~XMLContentModel(&this->super_XMLContentModel);
  return;
}

Assistant:

AllContentModel::~AllContentModel()
{
    for (XMLSize_t index = 0; index < fCount; index++)
        delete fChildren[index];
    fMemoryManager->deallocate(fChildren); //delete [] fChildren;
    fMemoryManager->deallocate(fChildOptional); //delete [] fChildOptional;
}